

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::setIconSize(QMainWindow *this,QSize *iconSize)

{
  long lVar1;
  bool bVar2;
  QMainWindowPrivate *this_00;
  QStyle *pQVar3;
  QSize *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int metric;
  QMainWindowPrivate *d;
  QSize sz;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize local_18;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMainWindow *)0x5e8fef);
  local_10 = *in_RSI;
  bVar2 = QSize::isValid((QSize *)this_00);
  if (!bVar2) {
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3b,0,in_RDI);
    QSize::QSize(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    local_10 = local_18;
  }
  bVar2 = ::operator!=(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                      );
  if (bVar2) {
    this_00->iconSize = local_10;
    iconSizeChanged((QMainWindow *)in_RDI,
                    (QSize *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  bVar2 = QSize::isValid((QSize *)this_00);
  this_00->explicitIconSize = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindow::setIconSize(const QSize &iconSize)
{
    Q_D(QMainWindow);
    QSize sz = iconSize;
    if (!sz.isValid()) {
        const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, nullptr, this);
        sz = QSize(metric, metric);
    }
    if (d->iconSize != sz) {
        d->iconSize = sz;
        emit iconSizeChanged(d->iconSize);
    }
    d->explicitIconSize = iconSize.isValid();
}